

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseAbiTags(State *state)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  undefined2 local_3a;
  undefined6 uStack_38;
  char *pcVar11;
  
  pcVar3 = state->mangled_cur;
  pcVar4 = state->out_cur;
  pcVar5 = state->out_begin;
  pcVar6 = state->out_end;
  uVar7 = *(undefined8 *)((long)&state->prev_name + 6);
  uStack_38 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
  local_3a = (undefined2)((ulong)pcVar6 >> 0x30);
  bVar1 = state->append;
  bVar2 = state->overflowed;
  state->append = false;
  pcVar11 = state->mangled_cur;
  if (*pcVar11 == 'B') {
    state->mangled_cur = pcVar11 + 1;
    bVar8 = ParseSourceName(state);
    pcVar11 = (char *)(ulong)bVar8;
  }
  else {
    bVar8 = false;
  }
  uVar10 = SUB81(pcVar11,0);
  if (bVar8 != false) {
    do {
      pcVar11 = state->mangled_cur;
      if (*pcVar11 != 'B') break;
      state->mangled_cur = pcVar11 + 1;
      bVar9 = ParseSourceName(state);
      pcVar11 = (char *)(ulong)bVar9;
    } while (bVar9);
    uVar10 = SUB81(pcVar11,0);
    if (bVar8 != false) {
      state->append = (bool)(bVar1 & 1);
      return (bool)uVar10;
    }
  }
  *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_38,local_3a);
  *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
  state->out_begin = pcVar5;
  state->out_end = pcVar6;
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar4;
  state->append = bVar1;
  state->overflowed = bVar2;
  return (bool)uVar10;
}

Assistant:

static bool ParseAbiTags(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (OneOrMore(ParseAbiTag, state)) {
    RestoreAppend(state, copy.append);
    return true;
  }
  *state = copy;
  return false;
}